

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_logging.cc
# Opt level: O0

void tcmalloc::Log(LogMode mode,char *filename,int line,LogItem a,LogItem b,LogItem c,LogItem d)

{
  code *pcVar1;
  bool bVar2;
  int length;
  size_t sVar3;
  undefined1 auStack_108 [4];
  int msglen;
  Logger state;
  int line_local;
  char *filename_local;
  undefined1 local_18 [4];
  LogMode mode_local;
  LogItem a_local;
  
  a_local._0_8_ = a.u_;
  local_18 = (undefined1  [4])a.tag_;
  _auStack_108 = &state.end_;
  state.p_ = state.buf_ + 0xc0;
  state.buf_._196_4_ = line;
  sVar3 = strlen(filename);
  bVar2 = Logger::AddStr((Logger *)auStack_108,filename,(int)sVar3);
  if ((((bVar2) && (bVar2 = Logger::AddStr((Logger *)auStack_108,":",1), bVar2)) &&
      (bVar2 = Logger::AddNum((Logger *)auStack_108,(long)(int)state.buf_._196_4_,10), bVar2)) &&
     (((bVar2 = Logger::AddStr((Logger *)auStack_108,"]",1), bVar2 &&
       (bVar2 = Logger::Add((Logger *)auStack_108,(LogItem *)local_18), bVar2)) &&
      ((bVar2 = Logger::Add((Logger *)auStack_108,&b), bVar2 &&
       (bVar2 = Logger::Add((Logger *)auStack_108,&c), bVar2)))))) {
    Logger::Add((Logger *)auStack_108,&d);
  }
  if (state.p_ <= _auStack_108) {
    _auStack_108 = (char **)(state.p_ + -1);
  }
  *(undefined1 *)_auStack_108 = 10;
  _auStack_108 = (char **)((long)_auStack_108 + 1);
  length = (int)_auStack_108 - ((int)auStack_108 + 0x10);
  if (mode != kLog) {
    WriteMessage((char *)&state.end_,length);
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  WriteMessage((char *)&state.end_,length);
  return;
}

Assistant:

void Log(LogMode mode, const char* filename, int line,
         LogItem a, LogItem b, LogItem c, LogItem d) {
  Logger state;
  state.p_ = state.buf_;
  state.end_ = state.buf_ + sizeof(state.buf_);
  state.AddStr(filename, strlen(filename))
      && state.AddStr(":", 1)
      && state.AddNum(line, 10)
      && state.AddStr("]", 1)
      && state.Add(a)
      && state.Add(b)
      && state.Add(c)
      && state.Add(d);

  // Teminate with newline
  if (state.p_ >= state.end_) {
    state.p_ = state.end_ - 1;
  }
  *state.p_ = '\n';
  state.p_++;

  int msglen = state.p_ - state.buf_;
  if (mode == kLog) {
    WriteMessage(state.buf_, msglen);
    return;
  }

  WriteMessage(state.buf_, msglen);

#if defined(__has_builtin)
#if __has_builtin(__builtin_trap)
  __builtin_trap();
#endif
#endif  // defined(__has_builtin)

  abort();
}